

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::setLocationHints(XMLSchemaDescriptionImpl *this,XMLCh *hint)

{
  BaseRefVectorOf<char16_t> *this_00;
  MemoryManager *manager;
  XMLCh *toAdd;
  XMLCh *hint_local;
  XMLSchemaDescriptionImpl *this_local;
  
  this_00 = &this->fLocationHints->super_BaseRefVectorOf<char16_t>;
  manager = XMLGrammarDescription::getMemoryManager((XMLGrammarDescription *)this);
  toAdd = XMLString::replicate(hint,manager);
  BaseRefVectorOf<char16_t>::addElement(this_00,toAdd);
  return;
}

Assistant:

void XMLSchemaDescriptionImpl::setLocationHints(const XMLCh* const hint)
{    
    fLocationHints->addElement(XMLString::replicate(hint, XMLGrammarDescription::getMemoryManager())); 
}